

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_x86_mov64Absolute
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,uint64_t value)

{
  uint8_t instruction [10];
  uint8_t local_a;
  byte local_9;
  undefined1 local_8;
  undefined1 local_7;
  undefined1 local_6;
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  
  local_a = 'H';
  local_9 = (byte)destination & 7 | 0xb8;
  local_8 = (undefined1)value;
  local_7 = (undefined1)(value >> 8);
  local_6 = (undefined1)(value >> 0x10);
  local_5 = (undefined1)(value >> 0x18);
  local_4 = (undefined1)(value >> 0x20);
  local_3 = (undefined1)(value >> 0x28);
  local_2 = (undefined1)(value >> 0x30);
  local_1 = (undefined1)(value >> 0x38);
  sysbvm_bytecodeJit_addBytes(jit,10,&local_a);
  return;
}

Assistant:

static void sysbvm_jit_x86_mov64Absolute(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, uint64_t value)
{
    uint8_t instruction[] = {
        sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
        0xB8 + (destination & SYSBVM_X86_REG_HALF_MASK),
        value & 0xFF, (value >> 8) & 0xFF, (value >> 16) & 0xFF, (value >> 24) & 0xFF,
        (value >> 32) & 0xFF, (value >> 40) & 0xFF, (value >> 48) & 0xFF, (value >> 56) & 0xFF,
    };

    sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
}